

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap_blitter.cpp
# Opt level: O2

QBlittable * __thiscall QBlittablePlatformPixmap::blittable(QBlittablePlatformPixmap *this)

{
  int iVar1;
  undefined4 extraout_var;
  QBlittable *pQVar2;
  QBlittablePlatformPixmap *that;
  long in_FS_OFFSET;
  undefined8 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->m_blittable).d;
  if (pQVar2 == (QBlittable *)0x0) {
    local_20._0_4_ = (this->super_QPlatformPixmap).w;
    local_20._4_4_ = (this->super_QPlatformPixmap).h;
    iVar1 = (*(this->super_QPlatformPixmap)._vptr_QPlatformPixmap[0x17])
                      (this,&local_20,(ulong)this->m_alpha);
    QScopedPointer<QBlittable,_QScopedPointerDeleter<QBlittable>_>::reset
              (&this->m_blittable,(QBlittable *)CONCAT44(extraout_var,iVar1));
    pQVar2 = (this->m_blittable).d;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QBlittable *QBlittablePlatformPixmap::blittable() const
{
    if (!m_blittable) {
        QBlittablePlatformPixmap *that = const_cast<QBlittablePlatformPixmap *>(this);
        that->m_blittable.reset(this->createBlittable(QSize(w, h), m_alpha));
    }

    return m_blittable.data();
}